

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

optional_idx __thiscall
duckdb::FunctionBinder::MultipleCandidateException<duckdb::AggregateFunction>
          (FunctionBinder *this,string *name,FunctionSet<duckdb::AggregateFunction> *functions,
          vector<unsigned_long,_true> *candidate_functions,
          vector<duckdb::LogicalType,_true> *arguments,ErrorData *error)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  AggregateFunction f;
  unsigned_long *conf;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_true> *__range2;
  string candidate_str;
  string call_str;
  BaseScalarFunction *in_stack_fffffffffffffc78;
  AggregateFunction *in_stack_fffffffffffffc80;
  ErrorData *this_00;
  FunctionSet<duckdb::AggregateFunction> *in_stack_fffffffffffffc88;
  allocator *paVar2;
  string local_358 [24];
  string *in_stack_fffffffffffffcc0;
  string local_338 [7];
  ExceptionType in_stack_fffffffffffffccf;
  ErrorData *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  string *in_stack_fffffffffffffcf8;
  string local_2f0 [32];
  ErrorData local_2d0;
  string local_250 [24];
  LogicalType *in_stack_fffffffffffffdc8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  string local_210 [336];
  reference local_c0;
  unsigned_long *local_b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b0;
  undefined8 local_a8;
  string local_a0 [48];
  LogicalType local_70;
  string local_58 [48];
  undefined8 local_28;
  optional_idx local_8;
  
  local_28 = in_RCX;
  LogicalType::LogicalType(&local_70,(LogicalTypeId)((ulong)in_R8 >> 0x38));
  Function::CallToString
            (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  LogicalType::~LogicalType((LogicalType *)0x28be60);
  ::std::__cxx11::string::string(local_a0);
  local_a8 = local_28;
  local_b0._M_current =
       (unsigned_long *)
       ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc78
                 );
  local_b8 = (unsigned_long *)
             ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffc78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc80,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffc78);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_b0);
    FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
              (in_stack_fffffffffffffc88,(idx_t)in_stack_fffffffffffffc80);
    BaseScalarFunction::ToString_abi_cxx11_(in_stack_fffffffffffffc78);
    ::std::operator+((char *)in_stack_fffffffffffffc88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc80);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc88,(char *)in_stack_fffffffffffffc80);
    ::std::__cxx11::string::operator+=(local_a0,local_210);
    ::std::__cxx11::string::~string(local_210);
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    ::std::__cxx11::string::~string(local_250);
    AggregateFunction::~AggregateFunction(in_stack_fffffffffffffc80);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_b0);
  }
  paVar2 = (allocator *)&stack0xfffffffffffffcef;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffcf0,
             "Could not choose a best candidate function for the function call \"%s\". In order to select one, please add explicit type casts.\n\tCandidate functions:\n%s"
             ,paVar2);
  ::std::__cxx11::string::string(local_338,local_58);
  ::std::__cxx11::string::string(local_358,local_a0);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  ErrorData::ErrorData
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccf,in_stack_fffffffffffffcc0);
  this_00 = &local_2d0;
  ErrorData::operator=(this_00,(ErrorData *)in_stack_fffffffffffffc78);
  ErrorData::~ErrorData(this_00);
  ::std::__cxx11::string::~string(local_2f0);
  ::std::__cxx11::string::~string(local_358);
  ::std::__cxx11::string::~string(local_338);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffcf0);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffcef);
  optional_idx::optional_idx(&local_8);
  ::std::__cxx11::string::~string(local_a0);
  ::std::__cxx11::string::~string(local_58);
  return (optional_idx)local_8.index;
}

Assistant:

optional_idx FunctionBinder::MultipleCandidateException(const string &name, FunctionSet<T> &functions,
                                                        vector<idx_t> &candidate_functions,
                                                        const vector<LogicalType> &arguments, ErrorData &error) {
	D_ASSERT(functions.functions.size() > 1);
	// there are multiple possible function definitions
	// throw an exception explaining which overloads are there
	string call_str = Function::CallToString(name, arguments);
	string candidate_str;
	for (auto &conf : candidate_functions) {
		T f = functions.GetFunctionByOffset(conf);
		candidate_str += "\t" + f.ToString() + "\n";
	}
	error = ErrorData(
	    ExceptionType::BINDER,
	    StringUtil::Format("Could not choose a best candidate function for the function call \"%s\". In order to "
	                       "select one, please add explicit type casts.\n\tCandidate functions:\n%s",
	                       call_str, candidate_str));
	return optional_idx();
}